

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanPoundName(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (long)end - (long)ptr;
  if ((long)uVar4 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar3 = 0;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_004dd573:
      iVar3 = 0;
      if (uVar4 < 4) {
        return -2;
      }
      goto switchD_004dd662_caseD_8;
    }
    if (bVar1 != 0) goto LAB_004dd5d3;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    if (bVar2 < 0x16) {
      if (bVar2 == 6) {
        if (uVar4 == 2) {
          return -2;
        }
        goto switchD_004dd662_caseD_8;
      }
      if (bVar2 != 7) goto switchD_004dd662_caseD_8;
      goto LAB_004dd573;
    }
    if ((bVar2 != 0x16) && (bVar2 != 0x18)) {
      if (bVar2 != 0x1d) goto switchD_004dd662_caseD_8;
      goto LAB_004dd5d3;
    }
  }
  else {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr))))
    goto switchD_004dd662_caseD_8;
LAB_004dd5d3:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_004dd662_caseD_8;
  }
  ptr = ptr + 2;
  uVar4 = (long)end - (long)ptr;
  while( true ) {
    if ((long)uVar4 < 2) {
      return -0x14;
    }
    bVar1 = ((byte *)ptr)[1];
    if (bVar1 < 0xdc) break;
    if (bVar1 == 0xff) {
      if (0xfd < (byte)*ptr) goto switchD_004dd662_caseD_8;
    }
    else if (bVar1 - 0xdc < 4) goto switchD_004dd662_caseD_8;
switchD_004dd662_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)
                  ) >> ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_004dd662_caseD_8;
switchD_004dd662_caseD_16:
    ptr = (char *)((byte *)ptr + 2);
    uVar4 = uVar4 - 2;
  }
  if (bVar1 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 6:
      if (uVar4 == 2) {
        return -2;
      }
      goto switchD_004dd662_caseD_8;
    case 7:
      goto switchD_004dd662_caseD_7;
    default:
      goto switchD_004dd662_caseD_8;
    case 9:
    case 10:
    case 0xb:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x24:
      iVar3 = 0x14;
      goto switchD_004dd662_caseD_8;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004dd662_caseD_16;
    case 0x1d:
      goto switchD_004dd662_caseD_1d;
    }
  }
  if (3 < bVar1 - 0xd8) goto switchD_004dd662_caseD_1d;
switchD_004dd662_caseD_7:
  if (uVar4 < 4) {
    return -2;
  }
switchD_004dd662_caseD_8:
  *nextTokPtr = ptr;
  return iVar3;
}

Assistant:

static int PTRCALL
PREFIX(scanPoundName)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_CR: case BT_LF: case BT_S:
    case BT_RPAR: case BT_GT: case BT_PERCNT: case BT_VERBAR:
      *nextTokPtr = ptr;
      return XML_TOK_POUND_NAME;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -XML_TOK_POUND_NAME;
}